

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

size_t absl::lts_20250127::container_internal::CapacityToGrowth(size_t capacity)

{
  bool bVar1;
  size_t capacity_local;
  
  bVar1 = IsValidCapacity(capacity);
  if (!bVar1) {
    __assert_fail("(IsValidCapacity(capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x622,"size_t absl::container_internal::CapacityToGrowth(size_t)");
  }
  return capacity - (capacity >> 3);
}

Assistant:

inline size_t CapacityToGrowth(size_t capacity) {
  ABSL_SWISSTABLE_ASSERT(IsValidCapacity(capacity));
  // `capacity*7/8`
  if (Group::kWidth == 8 && capacity == 7) {
    // x-x/8 does not work when x==7.
    return 6;
  }
  return capacity - capacity / 8;
}